

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O2

int read_line(lua_State *L,FILE *f,int chop)

{
  uint uVar1;
  char *pcVar2;
  lua_Unsigned lVar3;
  long lVar4;
  int unaff_EBP;
  luaL_Buffer b;
  
  luaL_buffinit(L,&b);
  do {
    pcVar2 = luaL_prepbuffsize(&b,0x400);
    flockfile((FILE *)f);
    for (lVar4 = 0; lVar4 != 0x400; lVar4 = lVar4 + 1) {
      unaff_EBP = getc_unlocked((FILE *)f);
      if ((unaff_EBP == -1) || (unaff_EBP == 10)) break;
      pcVar2[lVar4] = (char)unaff_EBP;
    }
    funlockfile((FILE *)f);
    b.n = lVar4 + b.n;
    if ((unaff_EBP == 10) || (unaff_EBP == -1)) {
      if (chop == 0 && unaff_EBP == 10) {
        if (b.size <= b.n) {
          luaL_prepbuffsize(&b,1);
        }
        b.b[b.n] = '\n';
        b.n = b.n + 1;
      }
      luaL_pushresult(&b);
      if (unaff_EBP == 10) {
        uVar1 = 1;
      }
      else {
        lVar3 = lua_rawlen(L,-1);
        uVar1 = (uint)(lVar3 != 0);
      }
      return uVar1;
    }
  } while( true );
}

Assistant:

static int read_line (lua_State *L, FILE *f, int chop) {
  luaL_Buffer b;
  int c;
  luaL_buffinit(L, &b);
  do {  /* may need to read several chunks to get whole line */
    char *buff = luaL_prepbuffer(&b);  /* preallocate buffer space */
    int i = 0;
    l_lockfile(f);  /* no memory errors can happen inside the lock */
    while (i < LUAL_BUFFERSIZE && (c = l_getc(f)) != EOF && c != '\n')
      buff[i++] = c;  /* read up to end of line or buffer limit */
    l_unlockfile(f);
    luaL_addsize(&b, i);
  } while (c != EOF && c != '\n');  /* repeat until end of line */
  if (!chop && c == '\n')  /* want a newline and have one? */
    luaL_addchar(&b, c);  /* add ending newline to result */
  luaL_pushresult(&b);  /* close buffer */
  /* return ok if read something (either a newline or something else) */
  return (c == '\n' || lua_rawlen(L, -1) > 0);
}